

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flv_read_header(FILE *flv,int *has_audio,int *has_video)

{
  size_t sVar1;
  char local_35;
  char local_34;
  char local_33;
  byte local_31;
  uint8_t h [13];
  int *has_video_local;
  int *has_audio_local;
  FILE *flv_local;
  
  h._5_8_ = has_video;
  sVar1 = fread(&local_35,1,0xd,(FILE *)flv);
  if (sVar1 == 0xd) {
    if (((local_35 == 'F') && (local_34 == 'L')) && (local_33 == 'V')) {
      *has_audio = local_31 & 4;
      *(uint *)h._5_8_ = local_31 & 1;
      flv_local._4_4_ = 1;
    }
    else {
      flv_local._4_4_ = 0;
    }
  }
  else {
    flv_local._4_4_ = 0;
  }
  return flv_local._4_4_;
}

Assistant:

int flv_read_header(FILE* flv, int* has_audio, int* has_video)
{
    uint8_t h[FLV_HEADER_SIZE];

    if (FLV_HEADER_SIZE != fread(&h[0], 1, FLV_HEADER_SIZE, flv)) {
        return 0;
    }

    if ('F' != h[0] || 'L' != h[1] || 'V' != h[2]) {
        return 0;
    }

    (*has_audio) = h[4] & 0x04;
    (*has_video) = h[4] & 0x01;
    return 1;
}